

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O1

void mean_double_suite::test_linear_increase_from_offset(void)

{
  undefined8 local_38;
  undefined8 local_30;
  
  local_38 = 0x4024000000000000;
  local_30 = 0x4024000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","10.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xb5,"void mean_double_suite::test_linear_increase_from_offset()",&local_38,&local_30)
  ;
  local_38 = 0x4025000000000000;
  local_30 = 0x4025000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","10.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xb7,"void mean_double_suite::test_linear_increase_from_offset()",&local_38,&local_30)
  ;
  local_38 = 0x4026000000000000;
  local_30 = 0x4026000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","11.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xb9,"void mean_double_suite::test_linear_increase_from_offset()",&local_38,&local_30)
  ;
  local_38 = 0x4027000000000000;
  local_30 = 0x4027000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","11.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xbb,"void mean_double_suite::test_linear_increase_from_offset()",&local_38,&local_30)
  ;
  local_38 = 0x4029000000000000;
  local_30 = 0x4029000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","12.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xbd,"void mean_double_suite::test_linear_increase_from_offset()",&local_38,&local_30)
  ;
  local_38 = 0x402b000000000000;
  local_30 = 0x402b000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","13.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xbf,"void mean_double_suite::test_linear_increase_from_offset()",&local_38,&local_30)
  ;
  return;
}

Assistant:

void test_linear_increase_from_offset()
{
    interim::moment<double, 4> filter;
    filter.push(10.0);
    TRIAL_TEST_EQ(filter.mean(), 10.0);
    filter.push(11.0);
    TRIAL_TEST_EQ(filter.mean(), 10.5);
    filter.push(12.0);
    TRIAL_TEST_EQ(filter.mean(), 11.0);
    filter.push(13.0);
    TRIAL_TEST_EQ(filter.mean(), 11.5);
    filter.push(14.0);
    TRIAL_TEST_EQ(filter.mean(), 12.5);
    filter.push(15.0);
    TRIAL_TEST_EQ(filter.mean(), 13.5);
}